

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O3

void __thiscall
QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation
          (QGraphicsAnchorLayoutPrivate *this,Orientation orientation)

{
  double dVar1;
  QGraphicsLayoutItem *this_00;
  bool bVar2;
  double dVar3;
  qreal *pqVar4;
  long lVar5;
  long in_FS_OFFSET;
  double dVar6;
  QRectF QStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  if (orientation == Horizontal) {
    QGraphicsLayoutItem::contentsRect(&QStack_38,this_00);
    pqVar4 = &QStack_38.w;
  }
  else {
    QGraphicsLayoutItem::contentsRect(&QStack_38,this_00);
    pqVar4 = &QStack_38.h;
  }
  dVar1 = *pqVar4;
  lVar5 = (long)(int)orientation;
  dVar6 = *(double *)((long)&this->spacings + lVar5 * 0x18);
  bVar2 = dVar6 <= dVar1;
  dVar3 = (double)(~-(ulong)(dVar1 < dVar6) & (ulong)dVar6 |
                  *(ulong *)((long)&this->spacings + lVar5 * 0x18 + -8) & -(ulong)(dVar1 < dVar6));
  if (dVar6 <= dVar1) {
    dVar6 = (this->sizeHints).m_data[lVar5 + -1]._M_elems[2];
  }
  (this->interpolationInterval).m_data[lVar5 + -1] = (uint)bVar2 * 3;
  *(ulong *)(&this->interpolationInterval)[lVar5].m_data =
       ~-(ulong)(dVar6 == dVar3) & (ulong)((dVar1 - dVar3) / (dVar6 - dVar3));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::setupEdgesInterpolation(
    Qt::Orientation orientation)
{
    Q_Q(QGraphicsAnchorLayout);

    qreal current;
    current = (orientation == Qt::Horizontal) ? q->contentsRect().width() : q->contentsRect().height();

    std::pair<Interval, qreal> result;
    result = getFactor(current,
                       sizeHints[orientation][Qt::MinimumSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::PreferredSize],
                       sizeHints[orientation][Qt::MaximumSize]);

    interpolationInterval[orientation] = result.first;
    interpolationProgress[orientation] = result.second;
}